

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

string_view gmlc::utilities::string_viewOps::removeQuotes(string_view str)

{
  char cVar1;
  string_view input;
  string_view sVar2;
  bool bVar3;
  const_reference pvVar4;
  size_t in_RSI;
  char *in_RDI;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  string_view ret;
  basic_string_view<char,_std::char_traits<char>_> *this;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_fffffffffffffff0;
  char *local_8;
  
  input._M_str = in_stack_fffffffffffffff0;
  input._M_len = in_RSI;
  sVar5._M_str = in_RDI;
  sVar5._M_len = (size_t)in_stack_ffffffffffffffd8;
  sVar5 = trim(input,sVar5);
  this = (basic_string_view<char,_std::char_traits<char>_> *)sVar5._M_len;
  local_8 = sVar5._M_str;
  bVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0);
  if ((!bVar3) &&
     (((pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffd0), *pvVar4 == '\"' ||
       (pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffd0), *pvVar4 == '\'')) ||
      (pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xffffffffffffffd0), *pvVar4 == '`')))) {
    pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::back
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0
                       );
    cVar1 = *pvVar4;
    pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0
                       );
    if (cVar1 == *pvVar4) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::size
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0);
      bVar6 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this,in_RSI,(size_type)in_RDI);
      this = (basic_string_view<char,_std::char_traits<char>_> *)bVar6._M_len;
      local_8 = bVar6._M_str;
    }
  }
  sVar2._M_str = local_8;
  sVar2._M_len = (size_t)this;
  return sVar2;
}

Assistant:

std::string_view removeQuotes(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '\"') || (ret.front() == '\'') ||
            (ret.front() == '`')) {
            if (ret.back() == ret.front()) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}